

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEvaluator.cpp
# Opt level: O0

double __thiscall simpleExpressionEvaluator::ExpressionEvaluator::_expr(ExpressionEvaluator *this)

{
  bool bVar1;
  double dVar2;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  double local_18;
  double result;
  ExpressionEvaluator *this_local;
  
  result = (double)this;
  local_18 = _term(this);
  while( true ) {
    bVar1 = true;
    if (this->_token != 0x2b) {
      bVar1 = this->_token == 0x2d;
    }
    if (!bVar1) break;
    if (this->_token == 0x2b) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"+ expected!",&local_39);
      _match(this,'+',&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator(&local_39);
      dVar2 = _term(this);
      local_18 = dVar2 + local_18;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"- expected!",&local_71);
      _match(this,'-',&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
      dVar2 = _term(this);
      local_18 = local_18 - dVar2;
    }
  }
  return local_18;
}

Assistant:

double ExpressionEvaluator::_expr()
{
	/* expr -> term  { '+' term | '-' term } */

	auto result = _term();
	while ((_token == '+') || (_token == '-'))
	{
		if (_token == '+')
		{
			_match('+', "+ expected!");
			result += _term();
		}
		else
		{
			_match('-', "- expected!");
			result -= _term();
		}
	}
	return result;
}